

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O0

Vec_Int_t * Abc_SclExtractBarBufs(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Mio_Gate_t *pMVar2;
  Abc_Obj_t *pObj_00;
  int local_34;
  int i;
  Abc_Obj_t *pObj;
  Mio_Gate_t *pBuffer;
  Vec_Int_t *vBufs;
  Abc_Ntk_t *pNtk_local;
  
  pMVar2 = Mio_LibraryReadBuf((Mio_Library_t *)pNtk->pManFunc);
  if (pMVar2 == (Mio_Gate_t *)0x0) {
    printf("Cannot find buffer in the current library. Quitting.\n");
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtk_local = (Abc_Ntk_t *)Vec_IntAlloc(100);
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pObj_00 = Abc_NtkObj(pNtk,local_34);
      if ((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsBarBuf(pObj_00), iVar1 != 0)) {
        if ((pObj_00->field_5).pData != (void *)0x0) {
          __assert_fail("pObj->pData == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                        ,0x12d,"Vec_Int_t *Abc_SclExtractBarBufs(Abc_Ntk_t *)");
        }
        (pObj_00->field_5).pData = pMVar2;
        Vec_IntPush((Vec_Int_t *)pNtk_local,local_34);
      }
    }
  }
  return (Vec_Int_t *)pNtk_local;
}

Assistant:

Vec_Int_t * Abc_SclExtractBarBufs( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vBufs;
    Mio_Gate_t * pBuffer;
    Abc_Obj_t * pObj; int i;
    pBuffer = Mio_LibraryReadBuf( (Mio_Library_t *)pNtk->pManFunc );
    if ( pBuffer == NULL )
    {
        printf( "Cannot find buffer in the current library. Quitting.\n" );
        return NULL;
    }
    vBufs = Vec_IntAlloc( 100 );
    Abc_NtkForEachBarBuf( pNtk, pObj, i )
    {
        assert( pObj->pData == NULL );
        pObj->pData = pBuffer;
        Vec_IntPush( vBufs, i );
    }
    return vBufs;
}